

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_swap_props(Tree *this,size_t n_,size_t m_)

{
  csubstr *pcVar1;
  csubstr *pcVar2;
  NodeData *pNVar3;
  NodeData *pNVar4;
  NodeType_e NVar5;
  code *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  bool bVar18;
  NodeScalar __tmp;
  
  if ((n_ == 0xffffffffffffffff) || (this->m_cap <= n_)) {
    if ((s_error_flags & 1) != 0) {
      bVar18 = is_debugger_attached();
      if (bVar18) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar3 = this->m_buf;
  if ((m_ == 0xffffffffffffffff) || (this->m_cap <= m_)) {
    if ((s_error_flags & 1) != 0) {
      bVar18 = is_debugger_attached();
      if (bVar18) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar4 = this->m_buf;
  NVar5 = pNVar3[n_].m_type.type;
  pNVar3[n_].m_type.type = pNVar4[m_].m_type.type;
  pNVar4[m_].m_type.type = NVar5;
  pcVar7 = pNVar3[n_].m_key.tag.str;
  sVar8 = pNVar3[n_].m_key.tag.len;
  pcVar1 = &pNVar3[n_].m_key.scalar;
  pcVar9 = pcVar1->str;
  sVar10 = pcVar1->len;
  pcVar1 = &pNVar3[n_].m_key.anchor;
  pcVar11 = pcVar1->str;
  sVar12 = pcVar1->len;
  pcVar13 = pNVar4[m_].m_key.tag.str;
  sVar14 = pNVar4[m_].m_key.tag.len;
  pcVar1 = &pNVar4[m_].m_key.scalar;
  pcVar15 = pcVar1->str;
  sVar16 = pcVar1->len;
  pcVar1 = &pNVar4[m_].m_key.anchor;
  sVar17 = pcVar1->len;
  pcVar2 = &pNVar3[n_].m_key.anchor;
  pcVar2->str = pcVar1->str;
  pcVar2->len = sVar17;
  pcVar1 = &pNVar3[n_].m_key.scalar;
  pcVar1->str = pcVar15;
  pcVar1->len = sVar16;
  pNVar3[n_].m_key.tag.str = pcVar13;
  pNVar3[n_].m_key.tag.len = sVar14;
  pcVar1 = &pNVar4[m_].m_key.anchor;
  pcVar1->str = pcVar11;
  pcVar1->len = sVar12;
  pcVar1 = &pNVar4[m_].m_key.scalar;
  pcVar1->str = pcVar9;
  pcVar1->len = sVar10;
  pNVar4[m_].m_key.tag.str = pcVar7;
  pNVar4[m_].m_key.tag.len = sVar8;
  pcVar7 = pNVar3[n_].m_val.tag.str;
  sVar8 = pNVar3[n_].m_val.tag.len;
  pcVar1 = &pNVar3[n_].m_val.scalar;
  pcVar9 = pcVar1->str;
  sVar10 = pcVar1->len;
  pcVar1 = &pNVar3[n_].m_val.anchor;
  pcVar11 = pcVar1->str;
  sVar12 = pcVar1->len;
  pcVar13 = pNVar4[m_].m_val.tag.str;
  sVar14 = pNVar4[m_].m_val.tag.len;
  pcVar1 = &pNVar4[m_].m_val.scalar;
  pcVar15 = pcVar1->str;
  sVar16 = pcVar1->len;
  pcVar1 = &pNVar4[m_].m_val.anchor;
  sVar17 = pcVar1->len;
  pcVar2 = &pNVar3[n_].m_val.anchor;
  pcVar2->str = pcVar1->str;
  pcVar2->len = sVar17;
  pcVar1 = &pNVar3[n_].m_val.scalar;
  pcVar1->str = pcVar15;
  pcVar1->len = sVar16;
  pNVar3[n_].m_val.tag.str = pcVar13;
  pNVar3[n_].m_val.tag.len = sVar14;
  pcVar1 = &pNVar4[m_].m_val.anchor;
  pcVar1->str = pcVar11;
  pcVar1->len = sVar12;
  pcVar1 = &pNVar4[m_].m_val.scalar;
  pcVar1->str = pcVar9;
  pcVar1->len = sVar10;
  pNVar4[m_].m_val.tag.str = pcVar7;
  pNVar4[m_].m_val.tag.len = sVar8;
  return;
}

Assistant:

void Tree::_swap_props(size_t n_, size_t m_)
{
    NodeData &C4_RESTRICT n = *_p(n_);
    NodeData &C4_RESTRICT m = *_p(m_);
    std::swap(n.m_type, m.m_type);
    std::swap(n.m_key, m.m_key);
    std::swap(n.m_val, m.m_val);
}